

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureBufferActiveUniformValidation::deinit(TextureBufferActiveUniformValidation *this)

{
  code *pcVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar5;
  uint local_1c;
  GLuint i;
  Functions *gl;
  TextureBufferActiveUniformValidation *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1680))(0);
  (**(code **)(lVar4 + 0x40))(0x8892,0);
  (**(code **)(lVar4 + 0x40))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
  local_1c = 0;
  while( true ) {
    sVar5 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                      (&this->m_texture_params);
    if (sVar5 <= local_1c) break;
    (**(code **)(lVar4 + 8))(local_1c + 0x84c0);
    (**(code **)(lVar4 + 0xb8))((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0);
    local_1c = local_1c + 1;
  }
  (**(code **)(lVar4 + 8))(0x84c0);
  if (this->m_po_id != 0) {
    (**(code **)(lVar4 + 0x448))(this->m_po_id);
    this->m_po_id = 0;
  }
  if (this->m_tbo_tex_ids != (GLuint *)0x0) {
    pcVar1 = *(code **)(lVar4 + 0x480);
    sVar5 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                      (&this->m_texture_params);
    (*pcVar1)(sVar5 & 0xffffffff,this->m_tbo_tex_ids);
    if (this->m_tbo_tex_ids != (GLuint *)0x0) {
      operator_delete__(this->m_tbo_tex_ids);
    }
    this->m_tbo_tex_ids = (GLuint *)0x0;
  }
  if (this->m_tbo_ids != (GLuint *)0x0) {
    pcVar1 = *(code **)(lVar4 + 0x438);
    sVar5 = std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::size
                      (&this->m_texture_params);
    (*pcVar1)(sVar5 & 0xffffffff,this->m_tbo_ids);
    if (this->m_tbo_ids != (GLuint *)0x0) {
      operator_delete__(this->m_tbo_ids);
    }
    this->m_tbo_ids = (GLuint *)0x0;
  }
  std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::clear
            (&this->m_texture_params);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureBufferActiveUniformValidation::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindBuffer(m_glExtTokens.TEXTURE_BUFFER, 0);

	for (glw::GLuint i = 0; i < m_texture_params.size(); ++i)
	{
		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(m_glExtTokens.TEXTURE_BUFFER, 0);
	}
	gl.activeTexture(GL_TEXTURE0);

	/* Delete GLES objects */
	if (0 != m_po_id)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}

	if (0 != m_tbo_tex_ids)
	{
		gl.deleteTextures((glw::GLsizei)m_texture_params.size(), m_tbo_tex_ids);
		delete[] m_tbo_tex_ids;
		m_tbo_tex_ids = 0;
	}

	if (0 != m_tbo_ids)
	{
		gl.deleteBuffers((glw::GLsizei)m_texture_params.size(), m_tbo_ids);
		delete[] m_tbo_ids;
		m_tbo_ids = 0;
	}

	m_texture_params.clear();

	/* Call base class' deinit() */
	TestCaseBase::deinit();
}